

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)24>_> *
vkt::api::anon_unknown_1::CommandPool::create
          (Move<vk::Handle<(vk::HandleType)24>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  undefined1 local_40 [8];
  VkCommandPoolCreateInfo cmdPoolInfo;
  Parameters *params_local;
  Resources *param_1_local;
  Environment *env_local;
  
  local_40._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolInfo._4_4_ = 0;
  cmdPoolInfo.pNext._0_4_ = params->flags;
  cmdPoolInfo.pNext._4_4_ = env->queueFamilyIndex;
  cmdPoolInfo._16_8_ = params;
  ::vk::createCommandPool
            (__return_storage_ptr__,env->vkd,env->device,(VkCommandPoolCreateInfo *)local_40,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkCommandPool> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkCommandPoolCreateInfo	cmdPoolInfo	=
		{
			VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
			DE_NULL,
			params.flags,
			env.queueFamilyIndex,
		};

		return createCommandPool(env.vkd, env.device, &cmdPoolInfo, env.allocationCallbacks);
	}